

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O1

TestCaseGroup * vkt::api::createDeviceInitializationTests(TestContext *testCtx)

{
  TestContext *pTVar1;
  TestNode *this;
  TestNode *pTVar2;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"device_init","Device Initialization Tests");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"create_instance_name_version","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_1::createInstanceTest;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"create_instance_invalid_api_version","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_1::createInstanceWithInvalidApiVersionTest;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"create_instance_null_appinfo","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_1::createInstanceWithNullApplicationInfoTest;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"create_instance_unsupported_extensions","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_1::createInstanceWithUnsupportedExtensionsTest;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"create_device","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_1::createDeviceTest;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"create_multiple_devices","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_1::createMultipleDevicesTest;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"create_device_unsupported_extensions","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_1::createDeviceWithUnsupportedExtensionsTest;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"create_device_various_queue_counts","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_1::createDeviceWithVariousQueueCountsTest;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"create_device_features2","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_1::createDeviceFeatures2Test;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createDeviceInitializationTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	deviceInitializationTests (new tcu::TestCaseGroup(testCtx, "device_init", "Device Initialization Tests"));

	addFunctionCase(deviceInitializationTests.get(), "create_instance_name_version",			"", createInstanceTest);
	addFunctionCase(deviceInitializationTests.get(), "create_instance_invalid_api_version",		"", createInstanceWithInvalidApiVersionTest);
	addFunctionCase(deviceInitializationTests.get(), "create_instance_null_appinfo",		    "", createInstanceWithNullApplicationInfoTest);
	addFunctionCase(deviceInitializationTests.get(), "create_instance_unsupported_extensions",	"", createInstanceWithUnsupportedExtensionsTest);
	addFunctionCase(deviceInitializationTests.get(), "create_device",							"", createDeviceTest);
	addFunctionCase(deviceInitializationTests.get(), "create_multiple_devices",					"", createMultipleDevicesTest);
	addFunctionCase(deviceInitializationTests.get(), "create_device_unsupported_extensions",	"", createDeviceWithUnsupportedExtensionsTest);
	addFunctionCase(deviceInitializationTests.get(), "create_device_various_queue_counts",		"", createDeviceWithVariousQueueCountsTest);
	addFunctionCase(deviceInitializationTests.get(), "create_device_features2",					"", createDeviceFeatures2Test);

	return deviceInitializationTests.release();
}